

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * Lowerer::HoistIndirOffset(Instr *instr,IndirOpnd *indirOpnd,RegNum regNum)

{
  code *pcVar1;
  bool bVar2;
  int32 offset_00;
  RegOpnd *pRVar3;
  undefined4 *puVar4;
  IntConstOpnd *src;
  StackSym *sym;
  Instr *instrAssign;
  RegOpnd *indexOpnd;
  IntConstOpnd *offsetOpnd;
  int32 offset;
  RegNum regNum_local;
  IndirOpnd *indirOpnd_local;
  Instr *instr_local;
  
  offset_00 = IR::IndirOpnd::GetOffset(indirOpnd);
  pRVar3 = IR::IndirOpnd::GetIndexOpnd(indirOpnd);
  if (pRVar3 == (RegOpnd *)0x0) {
    src = IR::IntConstOpnd::New((long)offset_00,TyInt32,instr->m_func,false);
    sym = StackSym::New(TyInt64,instr->m_func);
    pRVar3 = IR::RegOpnd::New(sym,regNum,TyInt64,instr->m_func);
    IR::IndirOpnd::SetOffset(indirOpnd,0,false);
    IR::IndirOpnd::SetIndexOpnd(indirOpnd,pRVar3);
    instr_local = InsertMove(&pRVar3->super_Opnd,&src->super_Opnd,instr,true);
    StackSym::SetIsIntConst(pRVar3->m_sym,(long)offset_00);
  }
  else {
    pRVar3 = IR::IndirOpnd::GetBaseOpnd(indirOpnd);
    if (pRVar3 == (RegOpnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3cb5,"(indirOpnd->GetBaseOpnd())","indirOpnd->GetBaseOpnd()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pRVar3 = IR::IndirOpnd::GetBaseOpnd(indirOpnd);
    instr_local = HoistIndirOffsetAsAdd(instr,indirOpnd,&pRVar3->super_Opnd,offset_00,regNum);
  }
  return instr_local;
}

Assistant:

IR::Instr *Lowerer::HoistIndirOffset(IR::Instr* instr, IR::IndirOpnd *indirOpnd, RegNum regNum)
{
    int32 offset = indirOpnd->GetOffset();
    if (indirOpnd->GetIndexOpnd())
    {
        Assert(indirOpnd->GetBaseOpnd());
        return Lowerer::HoistIndirOffsetAsAdd(instr, indirOpnd, indirOpnd->GetBaseOpnd(), offset, regNum);
    }
    IR::IntConstOpnd *offsetOpnd = IR::IntConstOpnd::New(offset, TyInt32, instr->m_func);
    IR::RegOpnd *indexOpnd = IR::RegOpnd::New(StackSym::New(TyMachReg, instr->m_func), regNum, TyMachReg, instr->m_func);

#if defined(DBG) && defined(_M_ARM)
    if (regNum == SCRATCH_REG)
    {
        AssertMsg(indirOpnd->GetBaseOpnd()->GetReg()!= SCRATCH_REG, "Why both are SCRATCH_REG");
        if (instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd())
        {
            Assert(instr->GetSrc1()->AsRegOpnd()->GetReg() != SCRATCH_REG);
        }
        if (instr->GetSrc2() && instr->GetSrc2()->IsRegOpnd())
        {
            Assert(instr->GetSrc2()->AsRegOpnd()->GetReg() != SCRATCH_REG);
        }
        if (instr->GetDst() && instr->GetDst()->IsRegOpnd())
        {
            Assert(instr->GetDst()->AsRegOpnd()->GetReg() != SCRATCH_REG);
        }
    }
#endif
    // Clear the offset and add a new reg as the index.
    indirOpnd->SetOffset(0);
    indirOpnd->SetIndexOpnd(indexOpnd);

    IR::Instr *instrAssign = Lowerer::InsertMove(indexOpnd, offsetOpnd, instr);
    indexOpnd->m_sym->SetIsIntConst(offset);
    return instrAssign;
}